

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcd.c
# Opt level: O3

OPJ_BOOL opj_tcd_rateallocate
                   (opj_tcd_t *tcd,OPJ_BYTE *dest,OPJ_UINT32 *p_data_written,OPJ_UINT32 len,
                   opj_codestream_info_t *cstr_info,opj_event_mgr_t *p_manager)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  opj_cp_t *p_cp;
  opj_tcd_tile_t *p_tile;
  opj_tcp_t *poVar5;
  opj_tcd_tilecomp_t *poVar6;
  opj_image_comp_t *poVar7;
  opj_tcd_resolution_t *poVar8;
  opj_tcd_precinct_t *poVar9;
  opj_tcd_cblk_enc_t *poVar10;
  opj_tcd_pass_t *poVar11;
  opj_tile_info_t *poVar12;
  double thresh;
  double dVar13;
  double dVar14;
  int iVar15;
  OPJ_BOOL OVar16;
  double *pdVar17;
  opj_t2_t *p_t2;
  long lVar18;
  uint uVar19;
  uint uVar20;
  int iVar21;
  OPJ_UINT32 layno;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  int iVar26;
  ulong uVar27;
  float fVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  OPJ_FLOAT64 OVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  OPJ_UINT32 local_3e8;
  double local_3d8;
  undefined4 local_3c8;
  undefined4 uStack_3c4;
  OPJ_FLOAT64 cumdisto [100];
  
  p_cp = tcd->cp;
  p_tile = tcd->tcd_image->tiles;
  poVar5 = tcd->tcp;
  p_tile->numpix = 0;
  uVar2 = p_tile->numcomps;
  if ((ulong)uVar2 == 0) {
    iVar15 = 0;
    dVar33 = 1.79769313486232e+308;
    dVar37 = 0.0;
    dVar34 = 0.0;
  }
  else {
    poVar6 = p_tile->comps;
    poVar7 = tcd->image->comps;
    dVar34 = 0.0;
    dVar33 = 1.79769313486232e+308;
    iVar15 = 0;
    uVar24 = 0;
    dVar37 = 0.0;
    do {
      poVar6[uVar24].numpix = 0;
      uVar3 = poVar6[uVar24].numresolutions;
      if ((ulong)uVar3 == 0) {
        dVar32 = 0.0;
      }
      else {
        poVar8 = poVar6[uVar24].resolutions;
        iVar26 = 0;
        uVar22 = 0;
        do {
          uVar4 = poVar8[uVar22].numbands;
          if ((ulong)uVar4 != 0) {
            uVar23 = 0;
            do {
              if (((poVar8[uVar22].bands[uVar23].x1 != poVar8[uVar22].bands[uVar23].x0) &&
                  (poVar8[uVar22].bands[uVar23].y1 != poVar8[uVar22].bands[uVar23].y0)) &&
                 (uVar19 = poVar8[uVar22].ph * poVar8[uVar22].pw, uVar19 != 0)) {
                poVar9 = poVar8[uVar22].bands[uVar23].precincts;
                uVar25 = 0;
                do {
                  uVar20 = poVar9[uVar25].ch * poVar9[uVar25].cw;
                  if (uVar20 != 0) {
                    uVar27 = 0;
                    do {
                      poVar10 = poVar9[uVar25].cblks.enc;
                      if ((ulong)poVar10[uVar27].totalpasses != 0) {
                        poVar11 = poVar10[uVar27].passes;
                        lVar18 = 0;
                        dVar32 = dVar34;
                        do {
                          iVar21 = *(int *)((long)&poVar11->rate + lVar18);
                          if (lVar18 == 0) {
                            OVar31 = poVar11->distortiondec;
                          }
                          else {
                            iVar21 = iVar21 - *(int *)((long)&poVar11[-1].rate + lVar18);
                            OVar31 = (OPJ_FLOAT64)
                                     (*(double *)((long)&poVar11->distortiondec + lVar18) -
                                     *(double *)((long)poVar11 + lVar18 + -0x10));
                          }
                          dVar34 = dVar32;
                          if (iVar21 != 0) {
                            dVar34 = (double)OVar31 / (double)iVar21;
                            dVar13 = dVar34;
                            if (dVar33 <= dVar34) {
                              dVar13 = dVar33;
                            }
                            dVar33 = dVar13;
                            if (dVar34 <= dVar32) {
                              dVar34 = dVar32;
                            }
                          }
                          lVar18 = lVar18 + 0x18;
                          dVar32 = dVar34;
                        } while ((ulong)poVar10[uVar27].totalpasses * 0x18 != lVar18);
                      }
                      iVar21 = (poVar10[uVar27].y1 - poVar10[uVar27].y0) *
                               (poVar10[uVar27].x1 - poVar10[uVar27].x0);
                      iVar15 = iVar15 + iVar21;
                      p_tile->numpix = iVar15;
                      iVar26 = iVar26 + iVar21;
                      poVar6[uVar24].numpix = iVar26;
                      uVar27 = uVar27 + 1;
                    } while (uVar27 != uVar20);
                  }
                  uVar25 = uVar25 + 1;
                } while (uVar25 != uVar19);
              }
              uVar23 = uVar23 + 1;
            } while (uVar23 != uVar4);
          }
          uVar22 = uVar22 + 1;
        } while (uVar22 != uVar3);
        dVar32 = (double)iVar26;
      }
      dVar13 = (double)(1 << ((byte)poVar7[uVar24].prec & 0x1f)) + -1.0;
      dVar37 = dVar37 + dVar13 * dVar13 * dVar32;
      uVar24 = uVar24 + 1;
    } while (uVar24 != uVar2);
  }
  if (cstr_info != (opj_codestream_info_t *)0x0) {
    poVar12 = cstr_info->tile;
    uVar2 = tcd->tcd_tileno;
    poVar12[uVar2].numpix = iVar15;
    poVar12[uVar2].distotile = (double)p_tile->distotile;
    pdVar17 = (double *)opj_malloc((ulong)poVar5->numlayers << 3);
    poVar12[uVar2].thresh = pdVar17;
    if (pdVar17 == (double *)0x0) {
      return 0;
    }
  }
  if (poVar5->numlayers != 0) {
    uVar24 = 0;
    do {
      local_3e8 = len;
      if (0.0 < (float)poVar5->rates[uVar24]) {
        fVar28 = ceilf((float)poVar5->rates[uVar24]);
        local_3e8 = (OPJ_UINT32)(long)fVar28;
        if (len <= local_3e8) {
          local_3e8 = len;
        }
      }
      dVar32 = (double)p_tile->distotile;
      dVar13 = pow(10.0,(double)((float)poVar5->distoratio[uVar24] / 10.0));
      bVar1 = *(byte *)((long)&p_cp->m_specific_param + 0x11);
      layno = (OPJ_UINT32)uVar24;
      if (((bVar1 & 1) == 0) || ((float)poVar5->rates[uVar24] <= 0.0)) {
        local_3c8 = 0;
        uStack_3c4 = 0xbff00000;
        if ((bVar1 & 4) != 0) {
          local_3c8 = 0;
          uStack_3c4 = 0xbff00000;
          if (0.0 < (float)poVar5->distoratio[uVar24]) goto LAB_00136fba;
        }
      }
      else {
LAB_00136fba:
        p_t2 = opj_t2_create(tcd->image,p_cp);
        if (p_t2 == (opj_t2_t *)0x0) {
          return 0;
        }
        local_3d8 = 0.0;
        iVar15 = 0x80;
        dVar35 = dVar33;
        dVar38 = dVar34;
        do {
          thresh = (dVar35 + dVar38) * 0.5;
          opj_tcd_makelayer(tcd,layno,(OPJ_FLOAT64)thresh,0);
          dVar36 = thresh;
          dVar39 = dVar38;
          dVar14 = local_3d8;
          if ((*(byte *)((long)&p_cp->m_specific_param + 0x11) & 4) == 0) {
            OVar16 = opj_t2_encode_packets
                               (p_t2,tcd->tcd_tileno,p_tile,layno + 1,dest,p_data_written,local_3e8,
                                cstr_info,tcd->cur_tp_num,tcd->tp_pos,tcd->cur_pino,THRESH_CALC,
                                p_manager);
            uVar29 = SUB84(dVar35,0);
            uVar30 = (undefined4)((ulong)dVar35 >> 0x20);
            dVar38 = thresh;
            local_3d8 = thresh;
            if (OVar16 != 0) {
LAB_001371e4:
              dVar36 = (double)CONCAT44(uVar30,uVar29);
              dVar39 = dVar38;
              dVar14 = local_3d8;
            }
          }
          else {
            if ((ushort)((short)*(undefined4 *)p_cp - 3U) < 4) {
              OVar16 = opj_t2_encode_packets
                                 (p_t2,tcd->tcd_tileno,p_tile,layno + 1,dest,p_data_written,
                                  local_3e8,cstr_info,tcd->cur_tp_num,tcd->tp_pos,tcd->cur_pino,
                                  THRESH_CALC,p_manager);
              if (OVar16 == 0) goto LAB_001371f2;
              if (uVar24 == 0) {
                OVar31 = p_tile->distolayer[0];
              }
              else {
                OVar31 = (OPJ_FLOAT64)
                         ((double)cumdisto[layno - 1] + (double)p_tile->distolayer[uVar24]);
              }
            }
            else if (uVar24 == 0) {
              OVar31 = p_tile->distolayer[0];
            }
            else {
              OVar31 = (OPJ_FLOAT64)
                       ((double)cumdisto[layno - 1] + (double)p_tile->distolayer[uVar24]);
            }
            uVar29 = SUB84(thresh,0);
            uVar30 = (undefined4)((ulong)thresh >> 0x20);
            dVar36 = dVar35;
            dVar39 = thresh;
            dVar14 = thresh;
            if (dVar32 - dVar37 / dVar13 <= (double)OVar31) goto LAB_001371e4;
          }
LAB_001371f2:
          local_3d8 = dVar14;
          iVar15 = iVar15 + -1;
          dVar35 = dVar36;
          dVar38 = dVar39;
        } while (iVar15 != 0);
        uVar22 = ~-(ulong)(local_3d8 == 0.0) & (ulong)local_3d8 |
                 (ulong)thresh & -(ulong)(local_3d8 == 0.0);
        opj_t2_destroy(p_t2);
        local_3c8 = (undefined4)uVar22;
        uStack_3c4 = (undefined4)(uVar22 >> 0x20);
      }
      if (cstr_info != (opj_codestream_info_t *)0x0) {
        cstr_info->tile[tcd->tcd_tileno].thresh[uVar24] = (double)CONCAT44(uStack_3c4,local_3c8);
      }
      opj_tcd_makelayer(tcd,layno,(OPJ_FLOAT64)CONCAT44(uStack_3c4,local_3c8),1);
      if (uVar24 == 0) {
        OVar31 = p_tile->distolayer[0];
      }
      else {
        OVar31 = (OPJ_FLOAT64)((double)cumdisto[uVar24 - 1] + (double)p_tile->distolayer[uVar24]);
      }
      cumdisto[uVar24] = OVar31;
      uVar24 = uVar24 + 1;
    } while (uVar24 < poVar5->numlayers);
  }
  return 1;
}

Assistant:

OPJ_BOOL opj_tcd_rateallocate(opj_tcd_t *tcd,
                              OPJ_BYTE *dest,
                              OPJ_UINT32 * p_data_written,
                              OPJ_UINT32 len,
                              opj_codestream_info_t *cstr_info,
                              opj_event_mgr_t *p_manager)
{
    OPJ_UINT32 compno, resno, bandno, precno, cblkno, layno;
    OPJ_UINT32 passno;
    OPJ_FLOAT64 min, max;
    OPJ_FLOAT64 cumdisto[100];      /* fixed_quality */
    const OPJ_FLOAT64 K = 1;                /* 1.1; fixed_quality */
    OPJ_FLOAT64 maxSE = 0;

    opj_cp_t *cp = tcd->cp;
    opj_tcd_tile_t *tcd_tile = tcd->tcd_image->tiles;
    opj_tcp_t *tcd_tcp = tcd->tcp;

    min = DBL_MAX;
    max = 0;

    tcd_tile->numpix = 0;           /* fixed_quality */

    for (compno = 0; compno < tcd_tile->numcomps; compno++) {
        opj_tcd_tilecomp_t *tilec = &tcd_tile->comps[compno];
        tilec->numpix = 0;

        for (resno = 0; resno < tilec->numresolutions; resno++) {
            opj_tcd_resolution_t *res = &tilec->resolutions[resno];

            for (bandno = 0; bandno < res->numbands; bandno++) {
                opj_tcd_band_t *band = &res->bands[bandno];

                /* Skip empty bands */
                if (opj_tcd_is_band_empty(band)) {
                    continue;
                }

                for (precno = 0; precno < res->pw * res->ph; precno++) {
                    opj_tcd_precinct_t *prc = &band->precincts[precno];

                    for (cblkno = 0; cblkno < prc->cw * prc->ch; cblkno++) {
                        opj_tcd_cblk_enc_t *cblk = &prc->cblks.enc[cblkno];

                        for (passno = 0; passno < cblk->totalpasses; passno++) {
                            opj_tcd_pass_t *pass = &cblk->passes[passno];
                            OPJ_INT32 dr;
                            OPJ_FLOAT64 dd, rdslope;

                            if (passno == 0) {
                                dr = (OPJ_INT32)pass->rate;
                                dd = pass->distortiondec;
                            } else {
                                dr = (OPJ_INT32)(pass->rate - cblk->passes[passno - 1].rate);
                                dd = pass->distortiondec - cblk->passes[passno - 1].distortiondec;
                            }

                            if (dr == 0) {
                                continue;
                            }

                            rdslope = dd / dr;
                            if (rdslope < min) {
                                min = rdslope;
                            }

                            if (rdslope > max) {
                                max = rdslope;
                            }
                        } /* passno */

                        /* fixed_quality */
                        tcd_tile->numpix += ((cblk->x1 - cblk->x0) * (cblk->y1 - cblk->y0));
                        tilec->numpix += ((cblk->x1 - cblk->x0) * (cblk->y1 - cblk->y0));
                    } /* cbklno */
                } /* precno */
            } /* bandno */
        } /* resno */

        maxSE += (((OPJ_FLOAT64)(1 << tcd->image->comps[compno].prec) - 1.0)
                  * ((OPJ_FLOAT64)(1 << tcd->image->comps[compno].prec) - 1.0))
                 * ((OPJ_FLOAT64)(tilec->numpix));
    } /* compno */

    /* index file */
    if (cstr_info) {
        opj_tile_info_t *tile_info = &cstr_info->tile[tcd->tcd_tileno];
        tile_info->numpix = tcd_tile->numpix;
        tile_info->distotile = tcd_tile->distotile;
        tile_info->thresh = (OPJ_FLOAT64 *) opj_malloc(tcd_tcp->numlayers * sizeof(
                                OPJ_FLOAT64));
        if (!tile_info->thresh) {
            /* FIXME event manager error callback */
            return OPJ_FALSE;
        }
    }

    for (layno = 0; layno < tcd_tcp->numlayers; layno++) {
        OPJ_FLOAT64 lo = min;
        OPJ_FLOAT64 hi = max;
        OPJ_UINT32 maxlen = tcd_tcp->rates[layno] > 0.0f ? opj_uint_min(((
                                OPJ_UINT32) ceil(tcd_tcp->rates[layno])), len) : len;
        OPJ_FLOAT64 goodthresh = 0;
        OPJ_FLOAT64 stable_thresh = 0;
        OPJ_UINT32 i;
        OPJ_FLOAT64 distotarget;                /* fixed_quality */

        /* fixed_quality */
        distotarget = tcd_tile->distotile - ((K * maxSE) / pow((OPJ_FLOAT32)10,
                                             tcd_tcp->distoratio[layno] / 10));

        /* Don't try to find an optimal threshold but rather take everything not included yet, if
          -r xx,yy,zz,0   (disto_alloc == 1 and rates == 0)
          -q xx,yy,zz,0   (fixed_quality == 1 and distoratio == 0)
          ==> possible to have some lossy layers and the last layer for sure lossless */
        if (((cp->m_specific_param.m_enc.m_disto_alloc == 1) &&
                (tcd_tcp->rates[layno] > 0.0f)) ||
                ((cp->m_specific_param.m_enc.m_fixed_quality == 1) &&
                 (tcd_tcp->distoratio[layno] > 0.0))) {
            opj_t2_t*t2 = opj_t2_create(tcd->image, cp);
            OPJ_FLOAT64 thresh = 0;

            if (t2 == 00) {
                return OPJ_FALSE;
            }

            for (i = 0; i < 128; ++i) {
                OPJ_FLOAT64 distoachieved = 0;  /* fixed_quality */

                thresh = (lo + hi) / 2;

                opj_tcd_makelayer(tcd, layno, thresh, 0);

                if (cp->m_specific_param.m_enc.m_fixed_quality) {       /* fixed_quality */
                    if (OPJ_IS_CINEMA(cp->rsiz)) {
                        if (! opj_t2_encode_packets(t2, tcd->tcd_tileno, tcd_tile, layno + 1, dest,
                                                    p_data_written, maxlen, cstr_info, tcd->cur_tp_num, tcd->tp_pos, tcd->cur_pino,
                                                    THRESH_CALC, p_manager)) {

                            lo = thresh;
                            continue;
                        } else {
                            distoachieved = layno == 0 ?
                                            tcd_tile->distolayer[0] : cumdisto[layno - 1] + tcd_tile->distolayer[layno];

                            if (distoachieved < distotarget) {
                                hi = thresh;
                                stable_thresh = thresh;
                                continue;
                            } else {
                                lo = thresh;
                            }
                        }
                    } else {
                        distoachieved = (layno == 0) ?
                                        tcd_tile->distolayer[0] : (cumdisto[layno - 1] + tcd_tile->distolayer[layno]);

                        if (distoachieved < distotarget) {
                            hi = thresh;
                            stable_thresh = thresh;
                            continue;
                        }
                        lo = thresh;
                    }
                } else {
                    if (! opj_t2_encode_packets(t2, tcd->tcd_tileno, tcd_tile, layno + 1, dest,
                                                p_data_written, maxlen, cstr_info, tcd->cur_tp_num, tcd->tp_pos, tcd->cur_pino,
                                                THRESH_CALC, p_manager)) {
                        /* TODO: what to do with l ??? seek / tell ??? */
                        /* opj_event_msg(tcd->cinfo, EVT_INFO, "rate alloc: len=%d, max=%d\n", l, maxlen); */
                        lo = thresh;
                        continue;
                    }

                    hi = thresh;
                    stable_thresh = thresh;
                }
            }

            goodthresh = stable_thresh == 0 ? thresh : stable_thresh;

            opj_t2_destroy(t2);
        } else {
            /* Special value to indicate to use all passes */
            goodthresh = -1;
        }

        if (cstr_info) { /* Threshold for Marcela Index */
            cstr_info->tile[tcd->tcd_tileno].thresh[layno] = goodthresh;
        }

        opj_tcd_makelayer(tcd, layno, goodthresh, 1);

        /* fixed_quality */
        cumdisto[layno] = (layno == 0) ? tcd_tile->distolayer[0] :
                          (cumdisto[layno - 1] + tcd_tile->distolayer[layno]);
    }

    return OPJ_TRUE;
}